

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_zip_large.c
# Opt level: O1

int64_t memory_read_seek(archive *a,void *client_data,int64_t offset,int whence)

{
  long lVar1;
  ulong uVar2;
  int64_t iVar3;
  ulong uVar4;
  
  if (whence == 2) {
    lVar1 = *(long *)((long)client_data + 0x10);
  }
  else {
    if (whence == 1) {
      *(long *)((long)client_data + 8) = *(long *)((long)client_data + 8) + offset;
      goto LAB_001f42c3;
    }
    if (whence != 0) {
      return -0x1e;
    }
    lVar1 = *client_data;
  }
  *(int64_t *)((long)client_data + 8) = offset + lVar1;
LAB_001f42c3:
  uVar4 = *client_data;
  uVar2 = *(ulong *)((long)client_data + 8);
  iVar3 = uVar2 - uVar4;
  if ((uVar2 < uVar4) || (uVar4 = *(ulong *)((long)client_data + 0x10), uVar4 < uVar2)) {
    *(ulong *)((long)client_data + 8) = uVar4;
    iVar3 = -0x19;
  }
  return iVar3;
}

Assistant:

static int64_t
memory_read_seek(struct archive *a, void *_private, int64_t offset, int whence)
{
	struct fileblocks *private = _private;

	(void)a;
	if (whence == SEEK_END) {
		offset = private->filesize + offset;
		whence = SEEK_SET;
	} else if (whence == SEEK_CUR) {
		offset = private->fileposition + offset;
		whence = SEEK_SET;
	}

	if (offset < 0) {
		fprintf(stderr, "\n\n\nInternal failure: negative seek\n\n\n");
		exit(1);
	}

	/* We've converted the request into a SEEK_SET. */
	private->fileposition = offset;

	/* Walk the block list to find the new position. */
	offset = 0;
	private->current = private->first;
	while (private->current != NULL) {
		if (offset + private->current->size > private->fileposition) {
			/* Position is in this block. */
			private->buff = (char *)private->current->buff
			    + private->fileposition - offset;
			private->gap_remaining = private->current->gap_size;
			return private->fileposition;
		}
		offset += private->current->size;
		if (offset + private->current->gap_size > private->fileposition) {
			/* Position is in this gap. */
			private->buff = NULL;
			private->gap_remaining = private->current->gap_size
			    - (private->fileposition - offset);
			return private->fileposition;
		}
		offset += private->current->gap_size;
		/* Skip to next block. */
		private->current = private->current->next;
	}
	if (private->fileposition == private->filesize) {
		return private->fileposition;
	}
	fprintf(stderr, "\n\n\nInternal failure: over-sized seek\n\n\n");
	exit(1);
}